

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persncal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::PersianCalendar::handleComputeMonthStart
          (PersianCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  int32_t iVar1;
  int iVar2;
  int32_t month_local;
  
  month_local = month;
  if (0xb < (uint)month) {
    iVar1 = ClockMath::floorDivide((double)month,0xc,&month_local);
    eyear = iVar1 + eyear;
  }
  iVar1 = ClockMath::floorDivide(eyear * 8 + 0x15,0x21);
  iVar2 = iVar1 + eyear * 0x16d + 0x1db932;
  if ((long)month_local != 0) {
    iVar2 = iVar2 + kPersianNumDays[month_local];
  }
  return iVar2;
}

Assistant:

int32_t PersianCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool /*useMonth*/) const {
    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        eyear += ClockMath::floorDivide(month, 12, month);
    }

    int32_t julianDay = PERSIAN_EPOCH - 1 + 365 * (eyear - 1) + ClockMath::floorDivide(8 * eyear + 21, 33);

    if (month != 0) {
        julianDay += kPersianNumDays[month];
    }

    return julianDay;
}